

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::LoadFile(XMLDocument *this,char *filename)

{
  FILE *__stream;
  char *in_RSI;
  XMLDocument *in_RDI;
  FILE *fp;
  XMLDocument *in_stack_ffffffffffffffe0;
  XMLDocument *fp_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  XMLError XVar1;
  
  fp_00 = in_RDI;
  Clear(in_stack_ffffffffffffffe0);
  __stream = (FILE *)callfopen((char *)in_stack_ffffffffffffffe0,(char *)in_RDI);
  if (__stream == (FILE *)0x0) {
    SetError(in_RDI,XML_ERROR_FILE_NOT_FOUND,in_RSI,(char *)0x0);
    XVar1 = in_RDI->_errorID;
  }
  else {
    LoadFile((XMLDocument *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (FILE *)fp_00);
    fclose(__stream);
    XVar1 = in_RDI->_errorID;
  }
  return XVar1;
}

Assistant:

XMLError XMLDocument::LoadFile( const char* filename )
{
    Clear();
    FILE* fp = callfopen( filename, "rb" );
    if ( !fp ) {
        SetError( XML_ERROR_FILE_NOT_FOUND, filename, 0 );
        return _errorID;
    }
    LoadFile( fp );
    fclose( fp );
    return _errorID;
}